

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VectorIO.cpp
# Opt level: O0

void amrex::writeLongData(Long *data,size_t size,ostream *os,IntDescriptor *id)

{
  bool bVar1;
  int iVar2;
  IntDescriptor *id_00;
  IntDescriptor *in_RCX;
  ostream *in_RDX;
  IntDescriptor *in_RSI;
  ostream *in_RDI;
  long *unaff_retaddr;
  IntDescriptor *this;
  size_t in_stack_fffffffffffffff8;
  
  this = in_RCX;
  id_00 = FPC::NativeLongDescriptor();
  bVar1 = IntDescriptor::operator==(in_RCX,id_00);
  if (bVar1) {
    std::ostream::write((char *)in_RDX,(long)in_RDI);
  }
  else {
    iVar2 = IntDescriptor::numBytes(this);
    if (iVar2 == 2) {
      writeIntData<short,long>((long *)in_RDI,(size_t)in_RSI,in_RDX,this);
    }
    else {
      iVar2 = IntDescriptor::numBytes(this);
      if (iVar2 == 4) {
        writeIntData<int,long>((long *)in_RDI,(size_t)in_RSI,in_RDX,this);
      }
      else {
        iVar2 = IntDescriptor::numBytes(this);
        if (iVar2 == 8) {
          writeIntData<long,long>(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,in_RSI);
        }
        else {
          Error_host((char *)in_RDX);
        }
      }
    }
  }
  return;
}

Assistant:

void amrex::writeLongData (const Long* data, std::size_t size, std::ostream& os,
                           const IntDescriptor& id)
{
    if (id == FPC::NativeLongDescriptor())
    {
        os.write((char*) data, size*sizeof(Long));
    }
    else if (id.numBytes() == 2)
    {
        writeIntData<std::int16_t, Long>(data, size, os, id);
    }
    else if (id.numBytes() == 4)
    {
        writeIntData<std::int32_t, Long>(data, size, os, id);
    }
    else if (id.numBytes() == 8)
    {
        writeIntData<std::int64_t, Long>(data, size, os, id);
    }
    else {
        amrex::Error("Don't know how to work with this long type.");
    }
}